

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::LockFile(PosixEnv *this,string *filename,FileLock **lock)

{
  FileLock **context;
  bool bVar1;
  int iVar2;
  char *__file;
  int *piVar3;
  PosixFileLock *this_00;
  undefined8 *in_RCX;
  string local_b8 [32];
  string local_98 [36];
  int local_74;
  undefined1 local_70 [4];
  int lock_errno;
  string local_60 [32];
  Slice local_40;
  int local_2c;
  undefined8 *puStack_28;
  int fd;
  FileLock **lock_local;
  string *filename_local;
  PosixEnv *this_local;
  
  *in_RCX = 0;
  puStack_28 = in_RCX;
  lock_local = lock;
  filename_local = filename;
  this_local = this;
  __file = (char *)std::__cxx11::string::c_str();
  local_2c = open(__file,0x80042,0x1a4);
  context = lock_local;
  if (local_2c < 0) {
    piVar3 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)context,*piVar3);
  }
  else {
    bVar1 = PosixLockTable::Insert((PosixLockTable *)(filename + 0xc0),(string *)lock_local);
    if (bVar1) {
      iVar2 = LockOrUnlock(local_2c,true);
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        local_74 = *piVar3;
        close(local_2c);
        PosixLockTable::Remove((PosixLockTable *)(filename + 0xc0),(string *)lock_local);
        std::operator+((char *)local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x149bcf
                      );
        PosixError((anon_unknown_1 *)this,local_98,local_74);
        std::__cxx11::string::~string((string *)local_98);
      }
      else {
        this_00 = (PosixFileLock *)operator_new(0x30);
        iVar2 = local_2c;
        std::__cxx11::string::string(local_b8,(string *)lock_local);
        PosixFileLock::PosixFileLock(this_00,iVar2,(string *)local_b8);
        *puStack_28 = this_00;
        std::__cxx11::string::~string(local_b8);
        Status::OK();
      }
    }
    else {
      close(local_2c);
      std::operator+((char *)local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x149bcf);
      Slice::Slice(&local_40,local_60);
      Slice::Slice((Slice *)local_70,"already held by process");
      Status::IOError((Status *)this,&local_40,(Slice *)local_70);
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status LockFile(const std::string& filename, FileLock** lock) override {
    *lock = nullptr;

    int fd = ::open(filename.c_str(), O_RDWR | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!locks_.Insert(filename)) {
      ::close(fd);
      return Status::IOError("lock " + filename, "already held by process");
    }

    if (LockOrUnlock(fd, true) == -1) {
      int lock_errno = errno;
      ::close(fd);
      locks_.Remove(filename);
      return PosixError("lock " + filename, lock_errno);
    }

    *lock = new PosixFileLock(fd, filename);
    return Status::OK();
  }